

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::Workflow(cmake *this,string *presetName,WorkflowListPresets listPresets,WorkflowFresh fresh)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  bool bVar2;
  string *psVar3;
  pointer ppVar4;
  WorkflowPreset *pWVar5;
  size_type sVar6;
  reference step_00;
  ConfigurePreset *pCVar7;
  reference pCVar8;
  ostream *poVar9;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  static_string_view type;
  string_view sVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9c0;
  CalculatedStep *step_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<CalculatedStep,_std::allocator<CalculatedStep>_> *__range1_1;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8db;
  undefined1 local_8da;
  bool first;
  int stepResult;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  string local_8b0 [32];
  string local_890 [32];
  iterator local_870;
  size_type local_868;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_860;
  function<int_()> local_848;
  string_view local_828;
  string_view local_818;
  PackagePreset *local_808;
  PackagePreset *packagePreset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  string local_7d0 [32];
  string local_7b0 [32];
  iterator local_790;
  size_type local_788;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_780;
  function<int_()> local_768;
  string_view local_748;
  string_view local_738;
  TestPreset *local_728;
  TestPreset *testPreset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  iterator local_690;
  size_type local_688;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_680;
  function<int_()> local_668;
  string_view local_648;
  string_view local_638;
  BuildPreset *local_628;
  BuildPreset *buildPreset;
  string_view local_600;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5eb;
  undefined1 local_5ea;
  allocator<char> local_5e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  string local_5c0 [32];
  string local_5a0 [32];
  iterator local_580;
  size_type local_578;
  undefined1 local_570 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ConfigurePreset *configurePreset;
  WorkflowStep *step;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
  *__range1;
  undefined1 local_518 [4];
  int stepNumber;
  vector<CalculatedStep,_std::allocator<CalculatedStep>_> steps;
  cmAlphaNum local_4f8;
  cmAlphaNum local_4c8;
  string local_498;
  cmAlphaNum local_478;
  cmAlphaNum local_448;
  string local_418;
  optional<cmCMakePresetsGraph::WorkflowPreset> *local_3f8;
  optional<cmCMakePresetsGraph::WorkflowPreset> *expandedPreset;
  cmAlphaNum local_3e8;
  cmAlphaNum local_3b8;
  string local_388;
  char local_361;
  cmAlphaNum local_360;
  cmAlphaNum local_330;
  string local_300;
  _Self local_2e0;
  _Self local_2d8;
  iterator presetPair;
  char *local_2c8;
  cmAlphaNum local_2c0;
  cmAlphaNum local_290;
  string local_260;
  ReadFileResult local_23c;
  undefined1 local_238 [4];
  ReadFileResult result;
  cmCMakePresetsGraph settingsFile;
  string local_48;
  WorkflowFresh local_28;
  WorkflowListPresets local_24;
  WorkflowFresh fresh_local;
  WorkflowListPresets listPresets_local;
  string *presetName_local;
  cmake *this_local;
  
  local_28 = fresh;
  local_24 = listPresets;
  _fresh_local = presetName;
  presetName_local = (string *)this;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory
            (this,(string *)
                  &settingsFile.Files.
                   super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &settingsFile.Files.
              super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCMakePresetsGraph::cmCMakePresetsGraph((cmCMakePresetsGraph *)local_238);
  psVar3 = GetHomeDirectory_abi_cxx11_(this);
  local_23c = cmCMakePresetsGraph::ReadProjectPresets((cmCMakePresetsGraph *)local_238,psVar3,false)
  ;
  if (local_23c == READ_OK) {
    if (local_24 == Yes) {
      cmCMakePresetsGraph::PrintWorkflowPresetList
                ((cmCMakePresetsGraph *)local_238,(PrintPrecedingNewline *)0x0);
      this_local._4_4_ = 0;
      presetPair._M_node._4_4_ = 1;
    }
    else {
      local_2d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
                   *)&settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  _fresh_local);
      local_2e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
                  *)&settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = std::operator==(&local_2d8,&local_2e0);
      if (bVar1) {
        cmAlphaNum::cmAlphaNum(&local_330,"No such workflow preset in ");
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        cmAlphaNum::cmAlphaNum(&local_360,psVar3);
        local_361 = '\"';
        cmStrCat<char[4],std::__cxx11::string,char>
                  (&local_300,&local_330,&local_360,(char (*) [4])0xd61fed,_fresh_local,&local_361);
        cmSystemTools::Error(&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        cmCMakePresetsGraph::PrintWorkflowPresetList
                  ((cmCMakePresetsGraph *)local_238,(PrintPrecedingNewline *)0x0);
        this_local._4_4_ = 1;
        presetPair._M_node._4_4_ = 1;
      }
      else {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
                 ::operator->(&local_2d8);
        if (((ppVar4->second).Unexpanded.super_Preset.Hidden & 1U) == 0) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>
                   ::operator->(&local_2d8);
          local_3f8 = &(ppVar4->second).Expanded;
          bVar1 = std::optional::operator_cast_to_bool((optional *)local_3f8);
          if (bVar1) {
            pWVar5 = std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator->(local_3f8);
            if (((pWVar5->super_Preset).ConditionResult & 1U) == 0) {
              cmAlphaNum::cmAlphaNum(&local_4c8,"Cannot use disabled workflow preset in ");
              psVar3 = GetHomeDirectory_abi_cxx11_(this);
              cmAlphaNum::cmAlphaNum(&local_4f8,psVar3);
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_ = 0x22;
              cmStrCat<char[4],std::__cxx11::string,char>
                        (&local_498,&local_4c8,&local_4f8,(char (*) [4])0xd61fed,_fresh_local,
                         (char *)((long)&steps.
                                         super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              cmSystemTools::Error(&local_498);
              std::__cxx11::string::~string((string *)&local_498);
              cmCMakePresetsGraph::PrintWorkflowPresetList
                        ((cmCMakePresetsGraph *)local_238,(PrintPrecedingNewline *)0x0);
              this_local._4_4_ = 1;
              presetPair._M_node._4_4_ = 1;
            }
            else {
              std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::vector
                        ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_518);
              pWVar5 = std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator->(local_3f8);
              sVar6 = std::
                      vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                      ::size(&pWVar5->Steps);
              std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::reserve
                        ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_518,sVar6)
              ;
              __range1._4_4_ = 1;
              pWVar5 = std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator->(local_3f8);
              __end1 = std::
                       vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                       ::begin(&pWVar5->Steps);
              step = (WorkflowStep *)
                     std::
                     vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>
                     ::end(&pWVar5->Steps);
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  (&__end1,(__normal_iterator<const_cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                                            *)&step);
                if (!bVar1) break;
                step_00 = __gnu_cxx::
                          __normal_iterator<const_cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                          ::operator*(&__end1);
                switch(step_00->PresetType) {
                case Configure:
                  type = ::cm::operator____s("configure",9);
                  args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)type.super_string_view._M_len;
                  pCVar7 = FindPresetForWorkflow<cmCMakePresetsGraph::ConfigurePreset>
                                     (this,type,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                                       *)((long)&settingsFile.errors.field_2 + 8),step_00);
                  if (pCVar7 == (ConfigurePreset *)0x0) {
                    this_local._4_4_ = 1;
                    goto LAB_0052a6fc;
                  }
                  local_5ea = 1;
                  local_5e8 = &local_5e0;
                  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)&local_5e0,(string *)psVar3);
                  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_5c0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_5c0,"--preset",&local_5e9);
                  local_5e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_5a0;
                  std::__cxx11::string::string((string *)local_5e8,(string *)&step_00->PresetName);
                  local_5ea = 0;
                  local_580 = &local_5e0;
                  local_578 = 3;
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::allocator(&local_5eb);
                  __l_02._M_len = local_578;
                  __l_02._M_array = local_580;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_570,__l_02,&local_5eb);
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~allocator(&local_5eb);
                  local_9c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_580;
                  do {
                    local_9c0 = local_9c0 + -1;
                    std::__cxx11::string::~string((string *)local_9c0);
                  } while (local_9c0 != &local_5e0);
                  std::allocator<char>::~allocator(&local_5e9);
                  if (local_28 == Yes) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const(&)[8]>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               local_570,(char (*) [8])"--fresh");
                  }
                  sVar11 = (string_view)::cm::operator____s("configure",9);
                  local_600 = sVar11;
                  BuildWorkflowStep((function<int_()> *)&buildPreset,this,
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_570);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)local_518,(int *)((long)&__range1 + 4),
                             (static_string_view *)&local_600,&step_00->PresetName,
                             (function<int_()> *)&buildPreset);
                  std::function<int_()>::~function((function<int_()> *)&buildPreset);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_570);
                  break;
                case Build:
                  sVar11 = (string_view)::cm::operator____s("build",5);
                  local_638 = sVar11;
                  local_628 = FindPresetForWorkflow<cmCMakePresetsGraph::BuildPreset>
                                        (this,(static_string_view)sVar11,
                                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                                          *)&settingsFile.ConfigurePresets._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count,step_00);
                  if (local_628 == (BuildPreset *)0x0) {
                    this_local._4_4_ = 1;
                    goto LAB_0052a6fc;
                  }
                  sVar11 = (string_view)::cm::operator____s("build",5);
                  testPreset._5_1_ = 1;
                  local_718 = &local_710;
                  local_648 = sVar11;
                  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)&local_710,(string *)psVar3);
                  local_718 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_6f0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_6f0,"--build",(allocator<char> *)((long)&testPreset + 7));
                  local_718 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_6d0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_6d0,"--preset",(allocator<char> *)((long)&testPreset + 6));
                  local_718 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_6b0;
                  std::__cxx11::string::string((string *)local_718,(string *)&step_00->PresetName);
                  testPreset._5_1_ = 0;
                  local_690 = &local_710;
                  local_688 = 4;
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)&testPreset + 4));
                  __l_01._M_len = local_688;
                  __l_01._M_array = local_690;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_680,__l_01,
                           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&testPreset + 4));
                  BuildWorkflowStep(&local_668,this,&local_680);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)local_518,(int *)((long)&__range1 + 4),
                             (static_string_view *)&local_648,&step_00->PresetName,&local_668);
                  std::function<int_()>::~function(&local_668);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_680);
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)&testPreset + 4));
                  local_a78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_690;
                  do {
                    local_a78 = local_a78 + -1;
                    std::__cxx11::string::~string((string *)local_a78);
                  } while (local_a78 != &local_710);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&testPreset + 6));
                  std::allocator<char>::~allocator((allocator<char> *)((long)&testPreset + 7));
                  break;
                case Test:
                  sVar11 = (string_view)::cm::operator____s("test",4);
                  local_738 = sVar11;
                  local_728 = FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
                                        (this,(static_string_view)sVar11,
                                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
                                          *)&settingsFile.BuildPresets._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count,step_00);
                  if (local_728 == (TestPreset *)0x0) {
                    this_local._4_4_ = 1;
                    goto LAB_0052a6fc;
                  }
                  sVar11 = (string_view)::cm::operator____s("test",4);
                  packagePreset._6_1_ = 1;
                  local_7f8 = &local_7f0;
                  local_748 = sVar11;
                  psVar3 = cmSystemTools::GetCTestCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)&local_7f0,(string *)psVar3);
                  local_7f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_7d0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_7d0,"--preset",(allocator<char> *)((long)&packagePreset + 7));
                  local_7f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_7b0;
                  std::__cxx11::string::string((string *)local_7f8,(string *)&step_00->PresetName);
                  packagePreset._6_1_ = 0;
                  local_790 = &local_7f0;
                  local_788 = 3;
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)&packagePreset + 5));
                  __l_00._M_len = local_788;
                  __l_00._M_array = local_790;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_780,__l_00,
                           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)&packagePreset + 5));
                  BuildWorkflowStep(&local_768,this,&local_780);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)local_518,(int *)((long)&__range1 + 4),
                             (static_string_view *)&local_748,&step_00->PresetName,&local_768);
                  std::function<int_()>::~function(&local_768);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_780);
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)&packagePreset + 5));
                  local_b08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_790;
                  do {
                    local_b08 = local_b08 + -1;
                    std::__cxx11::string::~string((string *)local_b08);
                  } while (local_b08 != &local_7f0);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&packagePreset + 7));
                  break;
                case Package:
                  sVar11 = (string_view)::cm::operator____s("package",7);
                  local_818 = sVar11;
                  local_808 = FindPresetForWorkflow<cmCMakePresetsGraph::PackagePreset>
                                        (this,(static_string_view)sVar11,
                                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
                                          *)&settingsFile.TestPresets._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count,step_00);
                  if (local_808 == (PackagePreset *)0x0) {
                    this_local._4_4_ = 1;
                    goto LAB_0052a6fc;
                  }
                  sVar11 = (string_view)::cm::operator____s("package",7);
                  local_8da = 1;
                  _stepResult = &local_8d0;
                  local_828 = sVar11;
                  psVar3 = cmSystemTools::GetCPackCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)&local_8d0,(string *)psVar3);
                  _stepResult = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_8b0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_8b0,"--preset",(allocator<char> *)&first);
                  _stepResult = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_890;
                  std::__cxx11::string::string((string *)_stepResult,(string *)&step_00->PresetName)
                  ;
                  local_8da = 0;
                  local_870 = &local_8d0;
                  local_868 = 3;
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::allocator(&local_8db);
                  __l._M_len = local_868;
                  __l._M_array = local_870;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_860,__l,&local_8db);
                  BuildWorkflowStep(&local_848,this,&local_860);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)local_518,(int *)((long)&__range1 + 4),
                             (static_string_view *)&local_828,&step_00->PresetName,&local_848);
                  std::function<int_()>::~function(&local_848);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_860);
                  std::
                  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~allocator(&local_8db);
                  local_b98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_870;
                  do {
                    local_b98 = local_b98 + -1;
                    std::__cxx11::string::~string((string *)local_b98);
                  } while (local_b98 != &local_8d0);
                  std::allocator<char>::~allocator((allocator<char> *)&first);
                }
                __range1._4_4_ = __range1._4_4_ + 1;
                __gnu_cxx::
                __normal_iterator<const_cmCMakePresetsGraph::WorkflowPreset::WorkflowStep_*,_std::vector<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep,_std::allocator<cmCMakePresetsGraph::WorkflowPreset::WorkflowStep>_>_>
                ::operator++(&__end1);
              }
              bVar1 = true;
              __end1_1 = std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::begin
                                   ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)
                                    local_518);
              step_1 = (CalculatedStep *)
                       std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::end
                                 ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)
                                  local_518);
              while( true ) {
                bVar2 = __gnu_cxx::operator!=
                                  (&__end1_1,
                                   (__normal_iterator<CalculatedStep_*,_std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>_>
                                    *)&step_1);
                if (!bVar2) break;
                pCVar8 = __gnu_cxx::
                         __normal_iterator<CalculatedStep_*,_std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>_>
                         ::operator*(&__end1_1);
                if (!bVar1) {
                  std::operator<<((ostream *)&std::cout,"\n");
                }
                poVar9 = std::operator<<((ostream *)&std::cout,"Executing workflow step ");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,pCVar8->StepNumber);
                poVar9 = std::operator<<(poVar9," of ");
                sVar6 = std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::size
                                  ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)
                                   local_518);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar6);
                poVar9 = std::operator<<(poVar9,": ");
                pbVar10 = std::operator<<(poVar9,(pCVar8->Type).super_string_view);
                poVar9 = std::operator<<(pbVar10," preset \"");
                poVar9 = std::operator<<(poVar9,(string *)&pCVar8->Name);
                poVar9 = std::operator<<(poVar9,"\"\n\n");
                std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
                this_local._4_4_ = std::function<int_()>::operator()(&pCVar8->Action);
                if (this_local._4_4_ != 0) goto LAB_0052a6fc;
                bVar1 = false;
                __gnu_cxx::
                __normal_iterator<CalculatedStep_*,_std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>_>
                ::operator++(&__end1_1);
              }
              this_local._4_4_ = 0;
LAB_0052a6fc:
              presetPair._M_node._4_4_ = 1;
              std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::~vector
                        ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)local_518);
            }
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_448,"Could not evaluate workflow preset \"");
            cmAlphaNum::cmAlphaNum(&local_478,_fresh_local);
            cmStrCat<char[27]>(&local_418,&local_448,&local_478,
                               (char (*) [27])"\": Invalid macro expansion");
            cmSystemTools::Error(&local_418);
            std::__cxx11::string::~string((string *)&local_418);
            cmCMakePresetsGraph::PrintWorkflowPresetList
                      ((cmCMakePresetsGraph *)local_238,(PrintPrecedingNewline *)0x0);
            this_local._4_4_ = 1;
            presetPair._M_node._4_4_ = 1;
          }
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_3b8,"Cannot use hidden workflow preset in ");
          psVar3 = GetHomeDirectory_abi_cxx11_(this);
          cmAlphaNum::cmAlphaNum(&local_3e8,psVar3);
          expandedPreset._7_1_ = 0x22;
          cmStrCat<char[4],std::__cxx11::string,char>
                    (&local_388,&local_3b8,&local_3e8,(char (*) [4])0xd61fed,_fresh_local,
                     (char *)((long)&expandedPreset + 7));
          cmSystemTools::Error(&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          cmCMakePresetsGraph::PrintWorkflowPresetList
                    ((cmCMakePresetsGraph *)local_238,(PrintPrecedingNewline *)0x0);
          this_local._4_4_ = 1;
          presetPair._M_node._4_4_ = 1;
        }
      }
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_290,"Could not read presets from ");
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    cmAlphaNum::cmAlphaNum(&local_2c0,psVar3);
    local_2c8 = cmCMakePresetsGraph::ResultToString(local_23c);
    cmStrCat<char[3],char_const*>
              (&local_260,&local_290,&local_2c0,(char (*) [3])0xd558c0,&local_2c8);
    cmSystemTools::Error(&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    this_local._4_4_ = 1;
    presetPair._M_node._4_4_ = 1;
  }
  cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)local_238);
  return this_local._4_4_;
}

Assistant:

int cmake::Workflow(const std::string& presetName,
                    WorkflowListPresets listPresets, WorkflowFresh fresh)
{
#ifndef CMAKE_BOOTSTRAP
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
  if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
    cmSystemTools::Error(
      cmStrCat("Could not read presets from ", this->GetHomeDirectory(), ": ",
               cmCMakePresetsGraph::ResultToString(result)));
    return 1;
  }

  if (listPresets == WorkflowListPresets::Yes) {
    settingsFile.PrintWorkflowPresetList();
    return 0;
  }

  auto presetPair = settingsFile.WorkflowPresets.find(presetName);
  if (presetPair == settingsFile.WorkflowPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate workflow preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  struct CalculatedStep
  {
    int StepNumber;
    cm::static_string_view Type;
    std::string Name;
    std::function<int()> Action;

    CalculatedStep(int stepNumber, cm::static_string_view type,
                   std::string name, std::function<int()> action)
      : StepNumber(stepNumber)
      , Type(type)
      , Name(std::move(name))
      , Action(std::move(action))
    {
    }
  };

  std::vector<CalculatedStep> steps;
  steps.reserve(expandedPreset->Steps.size());
  int stepNumber = 1;
  for (auto const& step : expandedPreset->Steps) {
    switch (step.PresetType) {
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::
        Configure: {
        auto const* configurePreset = this->FindPresetForWorkflow(
          "configure"_s, settingsFile.ConfigurePresets, step);
        if (!configurePreset) {
          return 1;
        }
        std::vector<std::string> args{ cmSystemTools::GetCMakeCommand(),
                                       "--preset", step.PresetName };
        if (fresh == WorkflowFresh::Yes) {
          args.emplace_back("--fresh");
        }
        steps.emplace_back(stepNumber, "configure"_s, step.PresetName,
                           this->BuildWorkflowStep(args));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Build: {
        auto const* buildPreset = this->FindPresetForWorkflow(
          "build"_s, settingsFile.BuildPresets, step);
        if (!buildPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "build"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCMakeCommand(),
                                    "--build", "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Test: {
        auto const* testPreset = this->FindPresetForWorkflow(
          "test"_s, settingsFile.TestPresets, step);
        if (!testPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "test"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCTestCommand(),
                                    "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Package: {
        auto const* packagePreset = this->FindPresetForWorkflow(
          "package"_s, settingsFile.PackagePresets, step);
        if (!packagePreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "package"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCPackCommand(),
                                    "--preset", step.PresetName }));
      } break;
    }
    stepNumber++;
  }

  int stepResult;
  bool first = true;
  for (auto const& step : steps) {
    if (!first) {
      std::cout << "\n";
    }
    std::cout << "Executing workflow step " << step.StepNumber << " of "
              << steps.size() << ": " << step.Type << " preset \"" << step.Name
              << "\"\n\n"
              << std::flush;
    if ((stepResult = step.Action()) != 0) {
      return stepResult;
    }
    first = false;
  }
#endif

  return 0;
}